

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::ParseStateTransitionTag(Parser *this,TiXmlHandle *handle)

{
  value_type pCVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference ppCVar6;
  bool condition;
  CPT *local_f8;
  reference local_c8;
  uint local_b4;
  int local_b0;
  int a;
  int s;
  int num_actions;
  int num_states;
  CPT *local_80;
  CPT *noisy_variant;
  CPT *transition;
  TiXmlElement *e_CondProb;
  allocator<char> local_51;
  string local_50;
  TiXmlHandle local_30;
  TiXmlHandle local_28;
  TiXmlElement *local_20;
  TiXmlElement *e_StateTransition;
  TiXmlHandle *handle_local;
  Parser *this_local;
  
  e_StateTransition = (TiXmlElement *)handle;
  handle_local = (TiXmlHandle *)this;
  util::tinyxml::TiXmlHandle::FirstChild(&local_30,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_28,(char *)&local_30);
  local_20 = util::tinyxml::TiXmlHandle::ToElement(&local_28);
  condition = local_20 != (TiXmlElement *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Cannot find StateTransitionFunction tag",&local_51);
  Ensure(this,condition,&local_50,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  for (transition = (CPT *)util::tinyxml::TiXmlNode::FirstChildElement(&local_20->super_TiXmlNode);
      transition != (CPT *)0x0;
      transition = (CPT *)util::tinyxml::TiXmlNode::NextSiblingElement((TiXmlNode *)transition)) {
    noisy_variant = CreateStateTransition(this,(TiXmlElement *)transition);
    (*(noisy_variant->super_Function)._vptr_Function[0xf])();
    std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::push_back
              (&this->transition_funcs_,&noisy_variant);
    if ((DAT_00278ab8 != 0.0) || (NAN(DAT_00278ab8))) {
      iVar2 = (*(noisy_variant->super_Function)._vptr_Function[0x11])(DAT_00278ab8);
      local_f8 = (CPT *)CONCAT44(extraout_var,iVar2);
    }
    else {
      local_f8 = noisy_variant;
    }
    local_80 = local_f8;
    std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::push_back
              (&this->noisy_transition_funcs_,&local_80);
    iVar2 = (*(noisy_variant->super_Function)._vptr_Function[0xc])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_states,
               "In <StateTransitionFunction>: Probability distribution does not sum to one!",
               (allocator<char> *)((long)&num_actions + 3));
    Ensure(this,(bool)((byte)iVar2 & 1),(string *)&num_states,(TiXmlBase *)transition);
    std::__cxx11::string::~string((string *)&num_states);
    std::allocator<char>::~allocator((allocator<char> *)((long)&num_actions + 3));
  }
  sVar3 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::size(&this->transition_funcs_)
  ;
  s = (int)sVar3;
  pvVar4 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  a = Variable::Size(&pvVar4->super_Variable);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->is_identity_,(long)s);
  for (local_b0 = 0; local_b0 < s; local_b0 = local_b0 + 1) {
    pvVar5 = std::
             vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ::operator[](&this->is_identity_,(long)local_b0);
    std::vector<bool,_std::allocator<bool>_>::resize(pvVar5,(long)a,false);
    for (local_b4 = 0; (int)local_b4 < a; local_b4 = local_b4 + 1) {
      ppCVar6 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                          (&this->transition_funcs_,(long)local_b0);
      pCVar1 = *ppCVar6;
      pvVar4 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                         (&this->action_vars_,0);
      iVar2 = (*(pCVar1->super_Function)._vptr_Function[0x10])(pCVar1,pvVar4,(ulong)local_b4);
      pvVar5 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](&this->is_identity_,(long)local_b0);
      local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar5,(long)(int)local_b4);
      std::_Bit_reference::operator=(&local_c8,(bool)((byte)iVar2 & 1));
    }
  }
  return;
}

Assistant:

void Parser::ParseStateTransitionTag(TiXmlHandle& handle) {
	TiXmlElement* e_StateTransition = handle.FirstChild("pomdpx").FirstChild(
		"StateTransitionFunction").ToElement();

	Ensure(e_StateTransition != NULL,
		"Cannot find StateTransitionFunction tag");

	TiXmlElement* e_CondProb = e_StateTransition->FirstChildElement();
	while (e_CondProb != 0) {
		CPT* transition = CreateStateTransition(e_CondProb);
		transition->ComputeSparseChildDistribution();
		transition_funcs_.push_back(transition);

		CPT* noisy_variant =
			Globals::config.noise ?
				transition->CreateNoisyVariant(Globals::config.noise) :
				transition;
		noisy_transition_funcs_.push_back(noisy_variant);

		Ensure(transition->Validate(),
			"In <StateTransitionFunction>: Probability distribution does not sum to one!",
			e_CondProb);

		e_CondProb = e_CondProb->NextSiblingElement();
	}

	// TODO: Check whether each state variable corresponds to one CondProb

	int num_states = transition_funcs_.size(), num_actions =
		action_vars_[0].Size();
	is_identity_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		is_identity_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			is_identity_[s][a] =
				transition_funcs_[s]->IsIdentityUnderConstraint(
					&action_vars_[0], a);
		}
	}
}